

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O0

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
GOESRProduct::getImage(GOESRProduct *this,Handler *config)

{
  bool bVar1;
  size_type sVar2;
  pointer this_00;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  *in_RSI;
  __uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true> in_RDI;
  Mat *in_stack_00000018;
  Image *in_stack_00000020;
  const_iterator it;
  unique_ptr<Image,_std::default_delete<Image>_> *image;
  shared_ptr<const_lrit::File> *in_stack_00000138;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  *in_stack_00000258;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>_>
  *in_stack_ffffffffffffff48;
  shared_ptr<const_lrit::File> *in_stack_ffffffffffffff50;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  *in_stack_ffffffffffffff60;
  _Self local_78;
  _Self local_70;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  *in_stack_ffffffffffffff98;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  *in_stack_ffffffffffffffa0;
  
  std::unique_ptr<Image,std::default_delete<Image>>::unique_ptr<std::default_delete<Image>,void>
            ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_ffffffffffffff50);
  sVar2 = std::
          vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
          ::size(in_RSI);
  if (sVar2 == 1) {
    std::
    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
    operator[](in_RSI,0);
    std::shared_ptr<const_lrit::File>::shared_ptr
              (in_stack_ffffffffffffff50,(shared_ptr<const_lrit::File> *)in_stack_ffffffffffffff48);
    Image::createFromFile(in_stack_00000138);
    std::unique_ptr<Image,_std::default_delete<Image>_>::operator=
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_ffffffffffffff50,
               (unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_ffffffffffffff48);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_ffffffffffffff60);
    std::shared_ptr<const_lrit::File>::~shared_ptr((shared_ptr<const_lrit::File> *)0x29d69d);
  }
  else {
    std::
    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
    vector(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Image::createFromFiles(in_stack_00000258);
    std::unique_ptr<Image,_std::default_delete<Image>_>::operator=
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_ffffffffffffff50,
               (unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_ffffffffffffff48);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)in_stack_ffffffffffffff60);
    std::
    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
    ~vector(in_stack_ffffffffffffff60);
  }
  this_00 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                      ((unique_ptr<Image,_std::default_delete<Image>_> *)0x29d743);
  Image::fillSides(this_00);
  local_70._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>_>
       ::find(in_stack_ffffffffffffff48,(key_type *)0x29d76d);
  local_78._M_node =
       (_Base_ptr)
       std::
       end<std::map<std::__cxx11::string,cv::Mat,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cv::Mat>>>>
                 (in_stack_ffffffffffffff48);
  bVar1 = std::operator!=(&local_70,&local_78);
  if (bVar1) {
    std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
              ((unique_ptr<Image,_std::default_delete<Image>_> *)0x29d7c2);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>
                  *)0x29d7d1);
    Image::remap(in_stack_00000020,in_stack_00000018);
  }
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (tuple<Image_*,_std::default_delete<Image>_>)
         in_RDI.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
         super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
         super__Head_base<0UL,_Image_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Image> GOESRProduct::getImage(const Config::Handler& config) const {
  std::unique_ptr<Image> image;
  if (files_.size() == 1) {
    image = Image::createFromFile(files_[0]);
  } else {
    image = Image::createFromFiles(files_);
  }

  // This turns the white fills outside the disk black
  image->fillSides();

  // Remap image values if configured for this channel
  auto it = config.remap.find(channel_.nameShort);
  if (it != std::end(config.remap)) {
    image->remap(it->second);
  }

  return image;
}